

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void dill_virtual_lea(dill_stream c,int dest,int src)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  dill_stream_conflict in_RDI;
  
  if (in_EDX < 100) {
    printf("error, attempt to do dill_virtual_lea on non-virtual\n");
  }
  else {
    iVar1 = dill_type_of(in_RDI,in_EDX);
    if (iVar1 == 0xc) {
      (*in_RDI->j->lea)(in_RDI,0,0,in_ESI,in_EDX,0);
    }
    else {
      printf("error, attempt to do dill_virtual_lea on variable of type other than V_B\n");
    }
  }
  return;
}

Assistant:

extern void
dill_virtual_lea(dill_stream c, int dest, int src)
{
    if (src < 100) {
        printf("error, attempt to do dill_virtual_lea on non-virtual\n");
        return;
    }
    if (dill_type_of(c, src) != DILL_B) {
        printf(
            "error, attempt to do dill_virtual_lea on variable of type other "
            "than V_B\n");
        return;
    }
    dill_lea(c, dest, src, 0);
}